

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_contextual_end(nk_context *ctx)

{
  nk_vec2 nVar1;
  nk_rect rect;
  int iVar2;
  int iVar3;
  nk_input *in_RDI;
  int in_body;
  int pressed;
  nk_vec2 padding;
  nk_rect body;
  nk_panel *panel;
  nk_window *popup;
  float fStackY_2c;
  undefined8 local_28;
  undefined8 uStackY_20;
  nk_key local_18;
  nk_context *ctx_00;
  
  if ((in_RDI != (nk_input *)0x0) && (*(long *)&in_RDI[0x31].keyboard.keys[7].clicked != 0)) {
    ctx_00 = *(nk_context **)&in_RDI[0x31].keyboard.keys[7].clicked;
    local_18 = (ctx_00->input).keyboard.keys[0x14];
    if ((*(nk_panel_type *)((long)local_18 + 4) & 0x400) != 0) {
      memset(&local_28,0,0x10);
      if (*(float *)((long)local_18 + 0x24) <
          *(float *)((long)local_18 + 0xc) + *(float *)((long)local_18 + 0x14)) {
        nVar1 = nk_panel_get_padding
                          ((nk_style *)&in_RDI[1].keyboard.keys[0].clicked,
                           *(nk_panel_type *)local_18);
        fStackY_2c = nVar1.y;
        fStackY_2c = *(float *)((long)local_18 + 0x24) + *(float *)((long)local_18 + 0x2c) +
                     *(float *)((long)local_18 + 0x34) + fStackY_2c;
        local_28._0_4_ = (undefined4)*(undefined8 *)((long)local_18 + 8);
        local_28 = CONCAT44(fStackY_2c,(undefined4)local_28);
        uStackY_20._0_4_ = (undefined4)*(undefined8 *)((long)local_18 + 0x10);
        uStackY_20 = CONCAT44((*(float *)((long)local_18 + 0xc) + *(float *)((long)local_18 + 0x14))
                              - fStackY_2c,(undefined4)uStackY_20);
      }
      iVar2 = nk_input_is_mouse_pressed(in_RDI,NK_BUTTON_LEFT);
      rect.w = (float)(undefined4)uStackY_20;
      rect.h = (float)uStackY_20._4_4_;
      rect.x = (float)(undefined4)local_28;
      rect.y = (float)local_28._4_4_;
      iVar3 = nk_input_is_mouse_hovering_rect(in_RDI,rect);
      if ((iVar2 != 0) && (iVar3 != 0)) {
        (ctx_00->input).keyboard.keys[9].down = (ctx_00->input).keyboard.keys[9].down | 0x1000;
      }
    }
    if (((ctx_00->input).keyboard.keys[9].down & 0x1000U) != 0) {
      (ctx_00->input).keyboard.keys[0].down = 0;
    }
    nk_popup_end(ctx_00);
  }
  return;
}

Assistant:

NK_API void
nk_contextual_end(struct nk_context *ctx)
{
    struct nk_window *popup;
    struct nk_panel *panel;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current) return;

    popup = ctx->current;
    panel = popup->layout;
    NK_ASSERT(popup->parent);
    NK_ASSERT(panel->type & NK_PANEL_SET_POPUP);
    if (panel->flags & NK_WINDOW_DYNAMIC) {
        /* Close behavior
        This is a bit hack solution since we do not now before we end our popup
        how big it will be. We therefore do not directly now when a
        click outside the non-blocking popup must close it at that direct frame.
        Instead it will be closed in the next frame.*/
        struct nk_rect body = {0,0,0,0};
        if (panel->at_y < (panel->bounds.y + panel->bounds.h)) {
            struct nk_vec2 padding = nk_panel_get_padding(&ctx->style, panel->type);
            body = panel->bounds;
            body.y = (panel->at_y + panel->footer_height + panel->border + padding.y);
            body.h = (panel->bounds.y + panel->bounds.h) - body.y;
        }

        {int pressed = nk_input_is_mouse_pressed(&ctx->input, NK_BUTTON_LEFT);
        int in_body = nk_input_is_mouse_hovering_rect(&ctx->input, body);
        if (pressed && in_body)
            popup->flags |= NK_WINDOW_HIDDEN;
        }
    }
    if (popup->flags & NK_WINDOW_HIDDEN)
        popup->seq = 0;
    nk_popup_end(ctx);
    return;
}